

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O2

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
          (rt_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_binary_expr<viennamath::rt_expression_interface<double>_> *other)

{
  auto_ptr_ref<const_viennamath::rt_expression_interface<double>_> __ref;
  undefined4 extraout_var;
  
  (this->rt_expr_)._M_ptr = (rt_expression_interface<double> *)0x0;
  __ref._M_ptr._0_4_ =
       (*(other->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(other);
  __ref._M_ptr._4_4_ = extraout_var;
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            (&this->rt_expr_,__ref);
  return;
}

Assistant:

rt_expr(rt_binary_expr<InterfaceType> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(other.clone());
      }